

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_path_unittest.cc
# Opt level: O2

void __thiscall GetUniquePathTest_Slurm_Test::TestBody(GetUniquePathTest_Slurm_Test *this)

{
  char *pcVar1;
  undefined1 local_1a8 [8];
  WithEnv withJobID;
  WithEnv withTestVar;
  string pathWithPID;
  char *expectedSlurmParent;
  WithEnv withRank;
  string expectedSlurmChild;
  WithEnv withForced;
  AssertionResult gtest_ar_4;
  allocator<char> local_39;
  undefined1 local_38 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_18;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(withJobID.val.field_2._M_local_buf + 8),"SLURM_JOB_ID",
             (allocator<char> *)(expectedSlurmChild.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expectedSlurmParent,"1",
             (allocator<char> *)(withTestVar.val.field_2._M_local_buf + 8));
  WithEnv::WithEnv((WithEnv *)local_1a8,(string *)((long)&withJobID.val.field_2 + 8),
                   (string *)&expectedSlurmParent);
  std::__cxx11::string::~string((string *)&expectedSlurmParent);
  std::__cxx11::string::~string((string *)(withJobID.val.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expectedSlurmParent,"GPROF_TEST_PATH",
             (allocator<char> *)(withTestVar.val.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(expectedSlurmChild.field_2._M_local_buf + 8),"/var/log/some_file_name",
             (allocator<char> *)(withRank.val.field_2._M_local_buf + 8));
  WithEnv::WithEnv((WithEnv *)((long)&withJobID.val.field_2 + 8),(string *)&expectedSlurmParent,
                   (string *)((long)&expectedSlurmChild.field_2 + 8));
  std::__cxx11::string::~string((string *)(expectedSlurmChild.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&expectedSlurmParent);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expectedSlurmParent,"/var/log/some_file_name",
             (allocator<char> *)(expectedSlurmChild.field_2._M_local_buf + 8));
  AppendPID((string *)((long)&withTestVar.val.field_2 + 8),(string *)&expectedSlurmParent);
  std::__cxx11::string::~string((string *)&expectedSlurmParent);
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)(expectedSlurmChild.field_2._M_local_buf + 8),"pathWithPID","GetTestPath()"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&withTestVar.val.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &expectedSlurmParent);
  std::__cxx11::string::~string((string *)&expectedSlurmParent);
  if (expectedSlurmChild.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)&expectedSlurmParent);
    if (withForced.var._M_dataplus._M_p == (pointer)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)withForced.var._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&withRank.val.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0x88,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&withRank.val.field_2 + 8),(Message *)&expectedSlurmParent);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&withRank.val.field_2 + 8));
    if (expectedSlurmParent != (char *)0x0) {
      (**(code **)(*(long *)expectedSlurmParent + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&withForced);
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)(expectedSlurmChild.field_2._M_local_buf + 8),"pathWithPID","GetTestPath()"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&withTestVar.val.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &expectedSlurmParent);
  std::__cxx11::string::~string((string *)&expectedSlurmParent);
  if (expectedSlurmChild.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)&expectedSlurmParent);
    if (withForced.var._M_dataplus._M_p == (pointer)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)withForced.var._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&withRank.val.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0x8c,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&withRank.val.field_2 + 8),(Message *)&expectedSlurmParent);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&withRank.val.field_2 + 8));
    if (expectedSlurmParent != (char *)0x0) {
      (**(code **)(*(long *)expectedSlurmParent + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&withForced);
  WithEnv::Reset((WithEnv *)((long)&withJobID.val.field_2 + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(expectedSlurmChild.field_2._M_local_buf + 8),"SLURM_PROCID",
             (allocator<char> *)local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(withRank.val.field_2._M_local_buf + 8),"5",
             (allocator<char> *)(withForced.val.field_2._M_local_buf + 8));
  WithEnv::WithEnv((WithEnv *)&expectedSlurmParent,(string *)((long)&expectedSlurmChild.field_2 + 8)
                   ,(string *)((long)&withRank.val.field_2 + 8));
  std::__cxx11::string::~string((string *)(withRank.val.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(expectedSlurmChild.field_2._M_local_buf + 8));
  pathWithPID.field_2._8_8_ = anon_var_dwarf_4611;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(expectedSlurmChild.field_2._M_local_buf + 8),
             "/var/log/some_file_name.slurmid-5",(allocator<char> *)local_38);
  AppendPID((string *)((long)&withRank.val.field_2 + 8),
            (string *)((long)&expectedSlurmChild.field_2 + 8));
  std::__cxx11::string::~string((string *)(expectedSlurmChild.field_2._M_local_buf + 8));
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
            ((internal *)local_38,"expectedSlurmParent","GetTestPath()",
             (char **)((long)&pathWithPID.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&expectedSlurmChild.field_2 + 8));
  std::__cxx11::string::~string((string *)(expectedSlurmChild.field_2._M_local_buf + 8));
  if (local_38[0] == (allocator<char>)0x0) {
    testing::Message::Message((Message *)((long)&expectedSlurmChild.field_2 + 8));
    if (gtest_ar_2._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_2._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&withForced.val.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0x95,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&withForced.val.field_2 + 8),
               (Message *)((long)&expectedSlurmChild.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&withForced.val.field_2 + 8));
    if ((long *)CONCAT71(expectedSlurmChild.field_2._9_7_,expectedSlurmChild.field_2._M_local_buf[8]
                        ) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(expectedSlurmChild.field_2._9_7_,
                                     expectedSlurmChild.field_2._M_local_buf[8]) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_2);
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_38,"expectedSlurmChild","GetTestPath()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&withRank.val.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&expectedSlurmChild.field_2 + 8));
  std::__cxx11::string::~string((string *)(expectedSlurmChild.field_2._M_local_buf + 8));
  if (local_38[0] == (allocator<char>)0x0) {
    testing::Message::Message((Message *)((long)&expectedSlurmChild.field_2 + 8));
    if (gtest_ar_2._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_2._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&withForced.val.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0x98,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&withForced.val.field_2 + 8),
               (Message *)((long)&expectedSlurmChild.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&withForced.val.field_2 + 8));
    if ((long *)CONCAT71(expectedSlurmChild.field_2._9_7_,expectedSlurmChild.field_2._M_local_buf[8]
                        ) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(expectedSlurmChild.field_2._9_7_,
                                     expectedSlurmChild.field_2._M_local_buf[8]) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_2);
  WithEnv::Reset((WithEnv *)((long)&withJobID.val.field_2 + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,"GPROF_TEST_PATH_USE_PID",(allocator<char> *)&local_18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(withForced.val.field_2._M_local_buf + 8),"1",&local_39);
  WithEnv::WithEnv((WithEnv *)((long)&expectedSlurmChild.field_2 + 8),(string *)local_38,
                   (string *)((long)&withForced.val.field_2 + 8));
  std::__cxx11::string::~string((string *)(withForced.val.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_38);
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)(withForced.val.field_2._M_local_buf + 8),"expectedSlurmChild",
             "GetTestPath()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&withRank.val.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  if (withForced.val.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)local_38);
    if (gtest_ar_4._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_4._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0x9e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if ((long *)CONCAT71(local_38._1_7_,local_38[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_38._1_7_,local_38[0]) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_4);
  GetTestPath_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)(withForced.val.field_2._M_local_buf + 8),"expectedSlurmChild",
             "GetTestPath()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&withRank.val.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  if (withForced.val.field_2._M_local_buf[8] == '\0') {
    testing::Message::Message((Message *)local_38);
    if (gtest_ar_4._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar_4._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/unique_path_unittest.cc"
               ,0xa1,pcVar1);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if ((long *)CONCAT71(local_38._1_7_,local_38[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_38._1_7_,local_38[0]) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar_4);
  WithEnv::~WithEnv((WithEnv *)((long)&expectedSlurmChild.field_2 + 8));
  std::__cxx11::string::~string((string *)(withRank.val.field_2._M_local_buf + 8));
  WithEnv::~WithEnv((WithEnv *)&expectedSlurmParent);
  std::__cxx11::string::~string((string *)(withTestVar.val.field_2._M_local_buf + 8));
  WithEnv::~WithEnv((WithEnv *)((long)&withJobID.val.field_2 + 8));
  WithEnv::~WithEnv((WithEnv *)local_1a8);
  return;
}

Assistant:

TEST(GetUniquePathTest, Slurm) {
  WithEnv withJobID("SLURM_JOB_ID", "1");
  WithEnv withTestVar(TEST_VAR, TEST_VAL);

  auto pathWithPID = AppendPID(TEST_VAL);

  // Test non-forced case (no process ID found)
  EXPECT_EQ(pathWithPID, GetTestPath());

  // Now that we ran GetUniquePathFromEnv once, we can test "child"
  // case, which appends pid
  EXPECT_EQ(pathWithPID, GetTestPath());

  withTestVar.Reset();
  WithEnv withRank("SLURM_PROCID", "5");

  const auto expectedSlurmParent = TEST_VAL ".slurmid-5";
  const auto expectedSlurmChild = AppendPID(expectedSlurmParent);

  // Test parent case - must include "proc id" (will set the child flag)
  EXPECT_EQ(expectedSlurmParent, GetTestPath());

  // Test child case
  EXPECT_EQ(expectedSlurmChild, GetTestPath());

  withTestVar.Reset();
  WithEnv withForced(TEST_VAR "_USE_PID", "1");

  // Now that pid is forced we expect both pid and proc-id appended.
  EXPECT_EQ(expectedSlurmChild, GetTestPath());

  // Test child case
  EXPECT_EQ(expectedSlurmChild, GetTestPath());
}